

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

Parameter * __thiscall ezc3d::ParametersNS::GroupNS::Group::parameter(Group *this,size_t idx)

{
  reference pvVar1;
  vector<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
  *in_RDI;
  out_of_range *anon_var_0;
  size_type in_stack_fffffffffffffeb8;
  
  pvVar1 = std::
           vector<ezc3d::ParametersNS::GroupNS::Parameter,_std::allocator<ezc3d::ParametersNS::GroupNS::Parameter>_>
           ::at(in_RDI,in_stack_fffffffffffffeb8);
  return pvVar1;
}

Assistant:

ezc3d::ParametersNS::GroupNS::Parameter &
ezc3d::ParametersNS::GroupNS::Group::parameter(size_t idx) {
  try {
    return _parameters.at(idx);
  } catch (const std::out_of_range&) {
    throw std::out_of_range(
        "Groups::parameter method is trying "
        "to access the parameter " +
        std::to_string(idx) + " while the maximum number of parameters is " +
        std::to_string(nbParameters()) + " in the group " + name() + ".");
  }
}